

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void string_suite::fail_as_int(void)

{
  char input [8];
  decoder_type decoder;
  undefined4 local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  value_type local_158 [8];
  basic_decoder<char> local_150;
  
  local_150.input.tail = local_158 + 7;
  builtin_memcpy(local_158,"\"alpha\"",8);
  local_150.input.head = local_158;
  memset(&local_150.current,0,0x120);
  local_150.current.code = uninitialized;
  local_150.current.view.head = (const_pointer)0x0;
  local_150.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_150);
  local_178._M_dataplus._M_p._0_4_ = local_150.current.code;
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6fa,"void string_suite::fail_as_int()",&local_178,&local_17c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_178,&local_150);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("decoder.string_value<std::string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6fb,"void string_suite::fail_as_int()",&local_178,"alpha");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_178._M_dataplus._M_p._4_4_,(value)local_178._M_dataplus._M_p) !=
      &local_178.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_178._M_dataplus._M_p._4_4_,(value)local_178._M_dataplus._M_p),
                    local_178.field_2._M_allocated_capacity + 1);
  }
  trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&local_150);
  boost::detail::throw_failed_impl
            ("decoder.signed_value<int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x6fd,"void string_suite::fail_as_int()");
  return;
}

Assistant:

void fail_as_int()
{
    const char input[] = "\"alpha\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "alpha");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(decoder.signed_value<int>(),
                                    json::error, "incompatible type");
}